

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

int secp256k1_modinv64_mul_cmp_62
              (secp256k1_modinv64_signed62 *a,int alen,secp256k1_modinv64_signed62 *b,int64_t factor
              )

{
  int64_t *piVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar6;
  undefined8 uStack_70;
  secp256k1_modinv64_signed62 bm;
  secp256k1_modinv64_signed62 am;
  ulong uVar5;
  
  secp256k1_modinv64_mul_62(&am,a,alen,1);
  secp256k1_modinv64_mul_62(&bm,b,5,factor);
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 4) {
      uVar3 = 4;
      while( true ) {
        if ((int)uVar3 < 0) {
          return 0;
        }
        uVar4 = (ulong)uVar3;
        uVar5 = (ulong)uVar3;
        if (am.v[uVar4] < bm.v[uVar5]) break;
        uVar3 = uVar3 - 1;
        if (bm.v[uVar5] < am.v[uVar4]) {
          return 1;
        }
      }
      return -1;
    }
    if (0x3fffffffffffffff < (ulong)am.v[lVar2]) break;
    piVar1 = bm.v + lVar2;
    lVar2 = lVar2 + 1;
    if (0x3fffffffffffffff < (ulong)*piVar1) {
      pcVar6 = "test condition failed: bm.v[i] >> 62 == 0";
      uStack_70 = 0x41;
LAB_001130b3:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv64_impl.h"
              ,uStack_70,pcVar6);
      abort();
    }
  }
  pcVar6 = "test condition failed: am.v[i] >> 62 == 0";
  uStack_70 = 0x40;
  goto LAB_001130b3;
}

Assistant:

static int secp256k1_modinv64_mul_cmp_62(const secp256k1_modinv64_signed62 *a, int alen, const secp256k1_modinv64_signed62 *b, int64_t factor) {
    int i;
    secp256k1_modinv64_signed62 am, bm;
    secp256k1_modinv64_mul_62(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv64_mul_62(&bm, b, 5, factor);
    for (i = 0; i < 4; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 62 == 0);
        VERIFY_CHECK(bm.v[i] >> 62 == 0);
    }
    for (i = 4; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}